

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyConfig.cpp
# Opt level: O3

ProxyConfig * ProxyConfig::getInstance(void)

{
  ProxyConfig *this;
  
  if (instance == (ProxyConfig *)0x0) {
    this = (ProxyConfig *)operator_new(0x68);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       *)this,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    this->m_isInit = false;
    instance = this;
  }
  return instance;
}

Assistant:

ProxyConfig* ProxyConfig::getInstance()
{
	if(instance == NULL)
	{
		instance = new ProxyConfig();
	}
	return instance;
}